

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

LOCK lock_create(void)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)malloc(0x28);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  return __mutex;
}

Assistant:

LOCK lock_create()
{
	LOCKINTERNAL *lock = (LOCKINTERNAL*)mem_alloc(sizeof(LOCKINTERNAL));

#if defined(CONF_FAMILY_UNIX)
	pthread_mutex_init(lock, 0x0);
#elif defined(CONF_FAMILY_WINDOWS)
	InitializeCriticalSection((LPCRITICAL_SECTION)lock);
#else
	#error not implemented on this platform
#endif
	return (LOCK)lock;
}